

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O0

_Bool blogc_is_ordered_list_item(char *str,size_t prefix_len)

{
  size_t sVar1;
  bool bVar2;
  ulong local_28;
  size_t i;
  size_t prefix_len_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    sVar1 = strlen(str);
    if (sVar1 < 2) {
      str_local._7_1_ = false;
    }
    else {
      local_28 = 0;
      while( true ) {
        bVar2 = false;
        if ('/' < str[local_28]) {
          bVar2 = str[local_28] < ':';
        }
        if (!bVar2) break;
        local_28 = local_28 + 1;
      }
      if (local_28 == 0) {
        str_local._7_1_ = false;
      }
      else if (str[local_28] == '.') {
        do {
          local_28 = local_28 + 1;
          bVar2 = false;
          if ((local_28 < prefix_len) && (bVar2 = true, str[local_28] != ' ')) {
            bVar2 = str[local_28] == '\t';
          }
        } while (bVar2);
        if (str[local_28] == '\0') {
          str_local._7_1_ = false;
        }
        else {
          str_local._7_1_ = local_28 == prefix_len;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

bool
blogc_is_ordered_list_item(const char *str, size_t prefix_len)
{
    if (str == NULL)
        return false;

    if (strlen(str) < 2)
        return false;

    size_t i;

    for (i = 0; str[i] >= '0' && str[i] <= '9'; i++);

    if (i == 0)
        return false;
    if (str[i] != '.')
        return false;

    for (i++; i < prefix_len && (str[i] == ' ' || str[i] == '\t'); i++);

    if (str[i] == '\0')
        return false;

    return i == prefix_len;
}